

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void av1_setup_motion_field(AV1_COMMON *cm)

{
  int iVar1;
  RefCntBuffer *pRVar2;
  AV1_COMMON *in_RDI;
  int is_lst_overlay;
  int alt_of_lst_order_hint;
  int ref_stamp;
  int order_hint;
  RefCntBuffer *buf;
  int ref_idx;
  int ref_frame;
  int ref_order_hint [7];
  RefCntBuffer *ref_buf [7];
  int cur_order_hint;
  int idx;
  int size;
  TPL_MV_REF *tpl_mvs_base;
  OrderHintInfo *order_hint_info;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  int iVar3;
  uint in_stack_ffffffffffffff64;
  int local_8c;
  uint auStack_88 [4];
  int local_78;
  int local_74;
  int local_70;
  long local_68 [8];
  uint local_24;
  int local_20;
  int local_1c;
  TPL_MV_REF *local_18;
  OrderHintInfo *oh;
  
  oh = &in_RDI->seq_params->order_hint_info;
  if (oh->enable_order_hint != 0) {
    local_18 = in_RDI->tpl_mvs;
    local_1c = ((in_RDI->mi_params).mi_rows + 0x20 >> 1) * ((in_RDI->mi_params).mi_stride >> 1);
    for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
      local_18[local_20].mfmv0.as_int = 0x80008000;
      local_18[local_20].ref_frame_offset = '\0';
    }
    local_24 = in_RDI->cur_frame->order_hint;
    for (local_8c = 1; local_8c < 8; local_8c = local_8c + 1) {
      pRVar2 = get_ref_frame_buf((AV1_COMMON *)
                                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                                 (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff5c >> 0x18));
      in_stack_ffffffffffffff64 = 0;
      if (pRVar2 != (RefCntBuffer *)0x0) {
        in_stack_ffffffffffffff64 = pRVar2->order_hint;
      }
      local_68[local_8c + -1] = (long)pRVar2;
      auStack_88[local_8c + -1] = in_stack_ffffffffffffff64;
    }
    iVar3 = 2;
    if (local_68[0] != 0) {
      if (*(int *)(local_68[0] + 0x20) != auStack_88[3]) {
        motion_field_projection(in_RDI,(MV_REFERENCE_FRAME)((ulong)oh >> 0x38),(int)oh);
      }
      iVar3 = iVar3 + -1;
    }
    iVar1 = get_relative_dist(oh,local_78,local_24);
    if ((0 < iVar1) &&
       (iVar1 = motion_field_projection(in_RDI,(MV_REFERENCE_FRAME)((ulong)oh >> 0x38),(int)oh),
       iVar1 != 0)) {
      iVar3 = iVar3 + -1;
    }
    iVar1 = get_relative_dist(oh,local_74,local_24);
    if ((0 < iVar1) &&
       (iVar1 = motion_field_projection(in_RDI,(MV_REFERENCE_FRAME)((ulong)oh >> 0x38),(int)oh),
       iVar1 != 0)) {
      iVar3 = iVar3 + -1;
    }
    iVar1 = get_relative_dist(oh,local_70,local_24);
    if (((0 < iVar1) && (-1 < iVar3)) &&
       (iVar1 = motion_field_projection(in_RDI,(MV_REFERENCE_FRAME)((ulong)oh >> 0x38),(int)oh),
       iVar1 != 0)) {
      iVar3 = iVar3 + -1;
    }
    if (-1 < iVar3) {
      motion_field_projection(in_RDI,(MV_REFERENCE_FRAME)((ulong)oh >> 0x38),(int)oh);
    }
  }
  return;
}

Assistant:

void av1_setup_motion_field(AV1_COMMON *cm) {
  const OrderHintInfo *const order_hint_info = &cm->seq_params->order_hint_info;

  if (!order_hint_info->enable_order_hint) return;

  TPL_MV_REF *tpl_mvs_base = cm->tpl_mvs;
  int size = ((cm->mi_params.mi_rows + MAX_MIB_SIZE) >> 1) *
             (cm->mi_params.mi_stride >> 1);
  for (int idx = 0; idx < size; ++idx) {
    tpl_mvs_base[idx].mfmv0.as_int = INVALID_MV;
    tpl_mvs_base[idx].ref_frame_offset = 0;
  }

  const int cur_order_hint = cm->cur_frame->order_hint;
  const RefCntBuffer *ref_buf[INTER_REFS_PER_FRAME];
  int ref_order_hint[INTER_REFS_PER_FRAME];

  for (int ref_frame = LAST_FRAME; ref_frame <= ALTREF_FRAME; ref_frame++) {
    const int ref_idx = ref_frame - LAST_FRAME;
    const RefCntBuffer *const buf = get_ref_frame_buf(cm, ref_frame);
    int order_hint = 0;

    if (buf != NULL) order_hint = buf->order_hint;

    ref_buf[ref_idx] = buf;
    ref_order_hint[ref_idx] = order_hint;
  }

  int ref_stamp = MFMV_STACK_SIZE - 1;

  if (ref_buf[LAST_FRAME - LAST_FRAME] != NULL) {
    const int alt_of_lst_order_hint =
        ref_buf[LAST_FRAME - LAST_FRAME]
            ->ref_order_hints[ALTREF_FRAME - LAST_FRAME];

    const int is_lst_overlay =
        (alt_of_lst_order_hint == ref_order_hint[GOLDEN_FRAME - LAST_FRAME]);
    if (!is_lst_overlay) motion_field_projection(cm, LAST_FRAME, 2);
    --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[BWDREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, BWDREF_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF2_FRAME - LAST_FRAME],
                        cur_order_hint) > 0) {
    if (motion_field_projection(cm, ALTREF2_FRAME, 0)) --ref_stamp;
  }

  if (get_relative_dist(order_hint_info,
                        ref_order_hint[ALTREF_FRAME - LAST_FRAME],
                        cur_order_hint) > 0 &&
      ref_stamp >= 0)
    if (motion_field_projection(cm, ALTREF_FRAME, 0)) --ref_stamp;

  if (ref_stamp >= 0) motion_field_projection(cm, LAST2_FRAME, 2);
}